

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cipher.h
# Opt level: O0

int mbedtls_cipher_get_iv_size(mbedtls_cipher_context_t *ctx)

{
  mbedtls_cipher_context_t *ctx_local;
  
  if (ctx->cipher_info == (mbedtls_cipher_info_t *)0x0) {
    ctx_local._4_4_ = 0;
  }
  else if (ctx->iv_size == 0) {
    ctx_local._4_4_ = ctx->cipher_info->iv_size;
  }
  else {
    ctx_local._4_4_ = (uint)ctx->iv_size;
  }
  return ctx_local._4_4_;
}

Assistant:

static inline int mbedtls_cipher_get_iv_size(
    const mbedtls_cipher_context_t *ctx )
{
    MBEDTLS_INTERNAL_VALIDATE_RET( ctx != NULL, 0 );
    if( ctx->cipher_info == NULL )
        return 0;

    if( ctx->iv_size != 0 )
        return (int) ctx->iv_size;

    return (int) ctx->cipher_info->iv_size;
}